

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

JsonNode * jsonMergePatch(JsonParse *pParse,u32 iTarget,JsonNode *pPatch)

{
  u8 *puVar1;
  uint n;
  char *__s2;
  int iVar2;
  uint uVar3;
  int iVar4;
  JsonNode *pJVar5;
  ulong uVar6;
  JsonNode *pJVar7;
  uint uVar8;
  long lVar9;
  JsonNode *pJVar10;
  uint uVar11;
  ulong uVar12;
  
  pJVar7 = pPatch;
  if (pPatch->eType == '\a') {
    if (pParse->aNode[iTarget].eType == '\a') {
      pJVar7 = pParse->aNode + iTarget;
      if (1 < pPatch->n) {
        uVar6 = 1;
        uVar3 = iTarget;
        do {
          n = pPatch[uVar6].n;
          __s2 = pPatch[uVar6].u.zJContent;
          uVar8 = pJVar7->n;
          uVar12 = 1;
          uVar11 = 1;
          iVar2 = (int)uVar6;
          if (1 < uVar8) {
            do {
              uVar11 = (uint)uVar12;
              if ((pJVar7[uVar12].n == n) &&
                 (iVar4 = strncmp(pJVar7[uVar12].u.zJContent,__s2,(ulong)n), iVar4 == 0)) {
                lVar9 = uVar12 + 1;
                if ((pJVar7[lVar9].jnFlags & 0x14) == 0) {
                  if (pPatch[iVar2 + 1U].eType == '\0') {
                    pJVar7[lVar9].jnFlags = pJVar7[lVar9].jnFlags | 4;
                  }
                  else {
                    pJVar5 = jsonMergePatch(pParse,iTarget + 1 + uVar11,pPatch + (iVar2 + 1U));
                    if (pJVar5 == (JsonNode *)0x0) {
                      return (JsonNode *)0x0;
                    }
                    pJVar7 = pParse->aNode + iTarget;
                    pJVar10 = pJVar7 + lVar9;
                    if (pJVar5 != pJVar10) {
                      (pJVar10->u).pPatch = pJVar5;
                      pJVar10->jnFlags = pJVar10->jnFlags | 0x10;
                    }
                  }
                }
                break;
              }
              iVar4 = 2;
              if (5 < pJVar7[uVar12 + 1].eType) {
                iVar4 = pJVar7[uVar12 + 1].n + 2;
              }
              uVar11 = uVar11 + iVar4;
              uVar12 = (ulong)uVar11;
            } while (uVar11 < uVar8);
          }
          uVar8 = iVar2 + 1;
          if ((pJVar7->n <= uVar11) && (pPatch[uVar8].eType != '\0')) {
            uVar11 = jsonParseAddNode(pParse,7,2,(char *)0x0);
            jsonParseAddNode(pParse,5,n,__s2);
            iVar4 = jsonParseAddNode(pParse,1,0,(char *)0x0);
            if (pParse->oom != '\0') {
              return (JsonNode *)0x0;
            }
            jsonRemoveAllNulls(pPatch);
            pJVar7 = pParse->aNode;
            pJVar7[uVar3].jnFlags = pJVar7[uVar3].jnFlags | 0x20;
            pJVar7[uVar3].u.iAppend = uVar11 - uVar3;
            pJVar5 = pParse->aNode;
            puVar1 = &pJVar5[iVar4].jnFlags;
            *puVar1 = *puVar1 | 0x10;
            pJVar7 = pJVar7 + iTarget;
            pJVar5[iVar4].u.zJContent = (char *)(pPatch + uVar8);
            uVar3 = uVar11;
          }
          iVar4 = 2;
          if (5 < pPatch[uVar8].eType) {
            iVar4 = pPatch[uVar8].n + 2;
          }
          uVar6 = (ulong)(uint)(iVar4 + iVar2);
        } while ((uint)(iVar4 + iVar2) < pPatch->n);
      }
    }
    else {
      jsonRemoveAllNulls(pPatch);
    }
  }
  return pJVar7;
}

Assistant:

static JsonNode *jsonMergePatch(
  JsonParse *pParse,   /* The JSON parser that contains the TARGET */
  u32 iTarget,         /* Node of the TARGET in pParse */
  JsonNode *pPatch     /* The PATCH */
){
  u32 i, j;
  u32 iRoot;
  JsonNode *pTarget;
  if( pPatch->eType!=JSON_OBJECT ){
    return pPatch;
  }
  assert( iTarget<pParse->nNode );
  pTarget = &pParse->aNode[iTarget];
  assert( (pPatch->jnFlags & JNODE_APPEND)==0 );
  if( pTarget->eType!=JSON_OBJECT ){
    jsonRemoveAllNulls(pPatch);
    return pPatch;
  }
  iRoot = iTarget;
  for(i=1; i<pPatch->n; i += jsonNodeSize(&pPatch[i+1])+1){
    u32 nKey;
    const char *zKey;
    assert( pPatch[i].eType==JSON_STRING );
    assert( pPatch[i].jnFlags & JNODE_LABEL );
    assert( pPatch[i].eU==1 );
    nKey = pPatch[i].n;
    zKey = pPatch[i].u.zJContent;
    assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
    for(j=1; j<pTarget->n; j += jsonNodeSize(&pTarget[j+1])+1 ){
      assert( pTarget[j].eType==JSON_STRING );
      assert( pTarget[j].jnFlags & JNODE_LABEL );
      assert( (pPatch[i].jnFlags & JNODE_RAW)==0 );
      if( pTarget[j].n==nKey && strncmp(pTarget[j].u.zJContent,zKey,nKey)==0 ){
        if( pTarget[j+1].jnFlags & (JNODE_REMOVE|JNODE_PATCH) ) break;
        if( pPatch[i+1].eType==JSON_NULL ){
          pTarget[j+1].jnFlags |= JNODE_REMOVE;
        }else{
          JsonNode *pNew = jsonMergePatch(pParse, iTarget+j+1, &pPatch[i+1]);
          if( pNew==0 ) return 0;
          pTarget = &pParse->aNode[iTarget];
          if( pNew!=&pTarget[j+1] ){
            assert( pTarget[j+1].eU==0
                 || pTarget[j+1].eU==1
                 || pTarget[j+1].eU==2 );
            testcase( pTarget[j+1].eU==1 );
            testcase( pTarget[j+1].eU==2 );
            VVA( pTarget[j+1].eU = 5 );
            pTarget[j+1].u.pPatch = pNew;
            pTarget[j+1].jnFlags |= JNODE_PATCH;
          }
        }
        break;
      }
    }
    if( j>=pTarget->n && pPatch[i+1].eType!=JSON_NULL ){
      int iStart, iPatch;
      iStart = jsonParseAddNode(pParse, JSON_OBJECT, 2, 0);
      jsonParseAddNode(pParse, JSON_STRING, nKey, zKey);
      iPatch = jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
      if( pParse->oom ) return 0;
      jsonRemoveAllNulls(pPatch);
      pTarget = &pParse->aNode[iTarget];
      assert( pParse->aNode[iRoot].eU==0 || pParse->aNode[iRoot].eU==2 );
      testcase( pParse->aNode[iRoot].eU==2 );
      pParse->aNode[iRoot].jnFlags |= JNODE_APPEND;
      VVA( pParse->aNode[iRoot].eU = 2 );
      pParse->aNode[iRoot].u.iAppend = iStart - iRoot;
      iRoot = iStart;
      assert( pParse->aNode[iPatch].eU==0 );
      VVA( pParse->aNode[iPatch].eU = 5 );
      pParse->aNode[iPatch].jnFlags |= JNODE_PATCH;
      pParse->aNode[iPatch].u.pPatch = &pPatch[i+1];
    }
  }
  return pTarget;
}